

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O3

void helicsEndpointSetTag(HelicsEndpoint end,char *tagname,char *tagvalue,HelicsError *err)

{
  Interface *this;
  size_t sVar1;
  size_t sVar2;
  _Alloc_hider _Var3;
  _Alloc_hider _Var4;
  string_view tag;
  string_view value;
  
  if (err == (HelicsError *)0x0) {
    if (end == (HelicsEndpoint)0x0) {
      return;
    }
    if (*(int *)((long)end + 0x20) != -0x4bac6b3e) {
      return;
    }
  }
  else {
    if (err->error_code != 0) {
      return;
    }
    if ((end == (HelicsEndpoint)0x0) || (*(int *)((long)end + 0x20) != -0x4bac6b3e)) {
      err->error_code = -3;
      err->message = "The given endpoint does not point to a valid object";
      return;
    }
  }
  this = *end;
  sVar1 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
  _Var4._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
  if (tagname != (char *)0x0) {
    sVar1 = strlen(tagname);
    _Var4._M_p = tagname;
  }
  sVar2 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
  _Var3._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
  if (tagvalue != (char *)0x0) {
    sVar2 = strlen(tagvalue);
    _Var3._M_p = tagvalue;
  }
  tag._M_str = _Var4._M_p;
  tag._M_len = sVar1;
  value._M_str = _Var3._M_p;
  value._M_len = sVar2;
  helics::Interface::setTag(this,tag,value);
  return;
}

Assistant:

void helicsEndpointSetTag(HelicsEndpoint end, const char* tagname, const char* tagvalue, HelicsError* err)
{
    auto* endObj = verifyEndpoint(end, err);
    if (endObj == nullptr) {
        return;
    }
    try {
        endObj->endPtr->setTag(AS_STRING_VIEW(tagname), AS_STRING_VIEW(tagvalue));
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}